

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FramebufferCache.cpp
# Opt level: O3

bool __thiscall
Diligent::FramebufferCache::FramebufferCacheKey::operator==
          (FramebufferCacheKey *this,FramebufferCacheKey *rhs)

{
  uint uVar1;
  size_t sVar2;
  size_t sVar3;
  long lVar4;
  bool bVar5;
  bool bVar6;
  
  sVar2 = GetHash(this);
  sVar3 = GetHash(rhs);
  if ((((sVar2 == sVar3) && (this->Pass == rhs->Pass)) &&
      (uVar1 = this->NumRenderTargets, uVar1 == rhs->NumRenderTargets)) &&
     (((this->DSV == rhs->DSV && (this->ShadingRate == rhs->ShadingRate)) &&
      (this->CommandQueueMask == rhs->CommandQueueMask)))) {
    if ((ulong)uVar1 == 0) {
      bVar5 = true;
    }
    else {
      lVar4 = 0;
      do {
        bVar5 = this->RTVs[lVar4] == rhs->RTVs[lVar4];
        if (!bVar5) {
          return bVar5;
        }
        bVar6 = (ulong)uVar1 - 1 != lVar4;
        lVar4 = lVar4 + 1;
      } while (bVar6);
    }
  }
  else {
    bVar5 = false;
  }
  return bVar5;
}

Assistant:

bool FramebufferCache::FramebufferCacheKey::operator==(const FramebufferCacheKey& rhs) const
{
    // clang-format off
    if (GetHash()        != rhs.GetHash()        ||
        Pass             != rhs.Pass             ||
        NumRenderTargets != rhs.NumRenderTargets ||
        DSV              != rhs.DSV              ||
        ShadingRate      != rhs.ShadingRate      ||
        CommandQueueMask != rhs.CommandQueueMask)
    {
        return false;
    }
    // clang-format on

    for (Uint32 rt = 0; rt < NumRenderTargets; ++rt)
        if (RTVs[rt] != rhs.RTVs[rt])
            return false;

    return true;
}